

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::setA(RigidBody *this,RotMat3x3d *a,int snapshotNo)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppAVar5;
  uint in_EDX;
  SquareMatrix3<double> *in_RSI;
  long in_RDI;
  uint i;
  SquareMatrix3<double> *in_stack_ffffffffffffff18;
  SquareMatrix3<double> *in_stack_ffffffffffffff20;
  value_type pAVar6;
  SquareMatrix3<double> *in_stack_ffffffffffffff48;
  undefined1 local_60 [72];
  uint local_18;
  uint local_14;
  
  local_14 = in_EDX;
  lVar2 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x20))(*(long **)(in_RDI + 0x18),in_EDX);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)(lVar2 + *(long *)(in_RDI + 0x10) + 0x48),(long)*(int *)(in_RDI + 0x30));
  SquareMatrix3<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  for (local_18 = 0; uVar3 = (ulong)local_18,
      sVar4 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), uVar3 < sVar4; local_18 = local_18 + 1) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_18);
    bVar1 = Atom::isDirectional((Atom *)0x24563a);
    if (bVar1) {
      ppAVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                          ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                           (in_RDI + 0x128),(ulong)local_18);
      pAVar6 = *ppAVar5;
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI + 0x170),(ulong)local_18);
      SquareMatrix3<double>::transpose(in_stack_ffffffffffffff48);
      OpenMD::operator*(in_stack_ffffffffffffff48,in_RSI);
      (*(pAVar6->super_StuntDouble)._vptr_StuntDouble[4])(pAVar6,local_60,(ulong)local_14);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2456d9);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2456e3);
    }
  }
  return;
}

Assistant:

void RigidBody::setA(const RotMat3x3d& a, int snapshotNo) {
    ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] = a;

    for (unsigned int i = 0; i < atoms_.size(); ++i) {
      if (atoms_[i]->isDirectional()) {
        atoms_[i]->setA(refOrients_[i].transpose() * a, snapshotNo);
      }
    }
  }